

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.c
# Opt level: O3

void dictionary_dump(dictionary *d,FILE *out)

{
  long lVar1;
  char *pcVar2;
  long lVar3;
  
  if (out != (FILE *)0x0 && d != (dictionary *)0x0) {
    if (d->n < 1) {
      fwrite("empty dictionary\n",0x11,1,(FILE *)out);
      return;
    }
    lVar1 = d->size;
    if (0 < lVar1) {
      lVar3 = 0;
      do {
        if (d->key[lVar3] != (char *)0x0) {
          pcVar2 = d->val[lVar3];
          if (pcVar2 == (char *)0x0) {
            pcVar2 = "UNDEF";
          }
          fprintf((FILE *)out,"%20s\t[%s]\n",d->key[lVar3],pcVar2);
          lVar1 = d->size;
        }
        lVar3 = lVar3 + 1;
      } while (lVar3 < lVar1);
    }
  }
  return;
}

Assistant:

void dictionary_dump(const dictionary * d, FILE * out)
{
    ssize_t  i ;

    if (d == NULL || out == NULL) return ;
    if (d->n < 1) {
        fprintf(out, "empty dictionary\n");
        return ;
    }
    for (i = 0 ; i < d->size ; i++) {
        if (d->key[i]) {
            fprintf(out, "%20s\t[%s]\n",
                    d->key[i],
                    d->val[i] ? d->val[i] : "UNDEF");
        }
    }
    return ;
}